

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::PrintTestPartResult(TestPartResult *test_part_result)

{
  char *pcVar1;
  String *this;
  String local_28;
  String *local_18;
  String *result;
  TestPartResult *test_part_result_local;
  
  this = &local_28;
  result = (String *)test_part_result;
  PrintTestPartResultToString((testing *)this,test_part_result);
  local_18 = this;
  pcVar1 = internal::String::c_str(this);
  printf("%s\n",pcVar1);
  fflush(_stdout);
  internal::String::~String(this);
  return;
}

Assistant:

static void PrintTestPartResult(const TestPartResult& test_part_result) {
  const internal::String& result =
      PrintTestPartResultToString(test_part_result);
  printf("%s\n", result.c_str());
  fflush(stdout);
  // If the test program runs in Visual Studio or a debugger, the
  // following statements add the test part result message to the Output
  // window such that the user can double-click on it to jump to the
  // corresponding source code location; otherwise they do nothing.
#if GTEST_OS_WINDOWS && !GTEST_OS_WINDOWS_MOBILE
  // We don't call OutputDebugString*() on Windows Mobile, as printing
  // to stdout is done by OutputDebugString() there already - we don't
  // want the same message printed twice.
  ::OutputDebugStringA(result.c_str());
  ::OutputDebugStringA("\n");
#endif
}